

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O2

Vec_Vec_t * Gia_ManDeriveCiTfo(Gia_Man_t *p)

{
  Vec_Ptr_t *p_00;
  Gia_Obj_t *pPivot;
  Vec_Int_t *Entry;
  int v;
  
  Gia_ManCleanMark0(p);
  Gia_ManIncrementTravId(p);
  p_00 = Vec_PtrAlloc(p->vCis->nSize);
  for (v = 0; v < p->vCis->nSize; v = v + 1) {
    pPivot = Gia_ManCi(p,v);
    if (pPivot == (Gia_Obj_t *)0x0) break;
    Entry = Gia_ManDeriveCiTfoOne(p,pPivot);
    Vec_PtrPush(p_00,Entry);
  }
  Gia_ManCleanMark0(p);
  return (Vec_Vec_t *)p_00;
}

Assistant:

Vec_Vec_t * Gia_ManDeriveCiTfo( Gia_Man_t * p )
{
    Vec_Ptr_t * vRes;
    Gia_Obj_t * pPivot;
    int i;
    Gia_ManCleanMark0( p );
    Gia_ManIncrementTravId( p );
    vRes = Vec_PtrAlloc( Gia_ManCiNum(p) );
    Gia_ManForEachCi( p, pPivot, i )
        Vec_PtrPush( vRes, Gia_ManDeriveCiTfoOne(p, pPivot) );
    Gia_ManCleanMark0( p );
    return (Vec_Vec_t *)vRes;
}